

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var __thiscall
Js::RegexHelper::RegexEs5ReplaceImpl
          (RegexHelper *this,ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
          JavascriptString *input,RecyclableObject *replacefn)

{
  size_t size;
  char16 c;
  RegexPattern *this_00;
  Var nonMatchValue;
  code *pcVar1;
  undefined8 this_01;
  Type scriptContext_00;
  Type TVar2;
  Type input_00;
  charcount_t cVar3;
  bool isGlobal;
  bool bVar4;
  uint16 uVar5;
  Attributes attributes;
  char16 *input_01;
  undefined4 *puVar6;
  StaticType *type;
  JavascriptString *input_02;
  Var pvVar7;
  uint64 uVar8;
  uint64 uVar9;
  JavascriptMethod p_Var10;
  RecyclableObject *ptr;
  ThreadContext *pTVar11;
  Type TVar12;
  CharCount CVar13;
  Type TVar14;
  void *pvVar15;
  GroupInfo GVar16;
  ThreadContext *pTVar17;
  Type TVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  GroupInfo GVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvStack_310;
  undefined1 local_308 [8];
  Builder<256U> concatenated;
  RegexMatchState state;
  Arguments local_98;
  Type local_88;
  Type local_80;
  Type local_78;
  Type local_70;
  Type local_68;
  Type local_60;
  Type local_58;
  GroupInfo local_50;
  Type local_48;
  bool local_3d;
  charcount_t local_3c;
  uint local_38;
  bool local_32;
  ImplicitCallFlags local_31;
  
  this_00 = (RegexPattern *)(scriptContext->super_ScriptContextBase).pActiveScriptDirect;
  pvStack_310 = (void *)0xd3db5b;
  local_68.word = (Type)input;
  input_01 = JavascriptString::GetString((JavascriptString *)regularExpression);
  pvStack_310 = (void *)0xd3db6a;
  local_3c = JavascriptString::GetLength((JavascriptString *)regularExpression);
  pvStack_310 = (void *)0xd3db75;
  uVar5 = UnifiedRegex::RegexPattern::NumGroups(this_00);
  lVar20 = *(long *)(this + 8);
  nonMatchValue = *(Var *)(lVar20 + 0x430);
  local_88.word = (Type)this_00;
  local_70.word = (Type)this;
  local_48.word = (Type)regularExpression;
  if ((short)uVar5 < 1) {
    local_50.offset._0_2_ = uVar5;
    AssertCount = AssertCount + 1;
    pvStack_310 = (void *)0xd3dbad;
    Throw::LogAssert();
    pvStack_310 = (void *)0xd3dbbd;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    pvStack_310 = (void *)0xd3dbe5;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x502,"(0 < numGroups && numGroups <= (32767))",
                                "0 < numGroups && numGroups <= (32767)");
    if (!bVar4) {
LAB_00d3e2c4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    lVar20 = *(long *)(local_70.word + 8);
    uVar5 = (uint16)local_50.offset;
  }
  TVar2.word = local_48.word;
  TVar18.word = local_70.word;
  TVar12.word = local_88.word;
  local_60.word = (Type)uVar5;
  pvStack_310 = (void *)0xd3dc1b;
  type = StringCache::GetStringTypeStatic((StringCache *)(lVar20 + 0xfa8));
  pvStack_310 = (void *)0xd3dc37;
  input_02 = &LiteralString::New(type,L"<replace function>",0x12,*(Recycler **)(lVar20 + 0x4e8))->
              super_JavascriptString;
  pvStack_310 = (void *)0xd3dc48;
  RegexHelperTrace((ScriptContext *)TVar18.word,(Use)scriptContext,(JavascriptRegExp *)TVar2.word,
                   input_02,(JavascriptString *)replacefn);
  uVar19 = 0;
  pvStack_310 = (void *)0xd3dc67;
  PrimBeginMatch((RegexMatchState *)&concatenated.isFinalized,(ScriptContext *)TVar18.word,
                 (RegexPattern *)TVar12.word,input_01,(CharCount)replacefn,false);
  pvStack_310 = (void *)0xd3dc6f;
  bVar4 = UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)TVar12.word);
  pvStack_310 = (void *)0xd3dc79;
  local_3d = UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)TVar12.word);
  cVar3 = local_3c;
  local_32 = bVar4;
  if (bVar4) {
    scriptContext->next = (ScriptContext *)0x0;
    *(undefined4 *)&scriptContext->prev = 0;
    uVar19 = 0;
  }
  else if ((local_3d) && (uVar19 = *(uint *)&scriptContext->prev, uVar19 == 0xfffffffe)) {
    pvStack_310 = (void *)0xd3dcb6;
    JavascriptRegExp::CacheLastIndex((JavascriptRegExp *)scriptContext);
    uVar19 = *(uint *)&scriptContext->prev;
  }
  TVar12.word = local_70.word;
  pvStack_310 = (void *)0xd3dcd4;
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_308,(ScriptContext *)local_70.word);
  pTVar11 = *(ThreadContext **)(TVar12.word + 0x3b8);
  uVar24 = (ulong)(uint)((int)local_60.word * 8);
  size = uVar24 + 0x18;
  pvStack_310 = (void *)0xd3dcf8;
  ThreadContext::ProbeStackNoDispose(pTVar11,size,(ScriptContext *)TVar12.word,(PVOID)0x0);
  lVar20 = -(ulong)((int)size + 0xfU & 0x1ffff0);
  *(void **)(local_308 + lVar20) = *(void **)(*(long *)(TVar12.word + 8) + 0x430);
  TVar18.word = local_48.word;
  *(Type *)((long)&concatenated + uVar24 + lVar20 + 8) = local_48.word;
  TVar2.word = local_48.word;
  pTVar17 = (ThreadContext *)concatenated._520_8_;
  if (uVar19 != 0) {
    CVar13 = cVar3;
    if (uVar19 < cVar3) {
      CVar13 = uVar19;
    }
    if (concatenated._520_8_ == 0) {
      replacefn._0_4_ = 0;
      replacefn._4_4_ = 0;
      *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dd65;
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                ((JavascriptString *)TVar18.word,0,CVar13,(Builder<256U> *)local_308,false);
      pTVar11 = (ThreadContext *)TVar18.word;
    }
    else {
      *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dd4a;
      CompoundString::Append((CompoundString *)pTVar17,(JavascriptString *)TVar2.word,0,CVar13);
      pTVar11 = pTVar17;
    }
  }
  if (cVar3 < uVar19) {
    local_50.offset = 0;
    local_50.length = 0;
    uVar23 = 0;
    uVar21 = 0xffffffff00000000;
    uVar24 = 0xffffffff00000000;
    local_38 = uVar19;
  }
  else {
    *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dd9e;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    TVar18.word = local_88.word;
    pTVar11 = (ThreadContext *)&concatenated.isFinalized;
    replacefn._4_4_ = 0;
    replacefn._0_4_ = uVar19;
    *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3ddba;
    GVar22 = PrimMatch((RegexMatchState *)pTVar11,(ScriptContext *)TVar12.word,
                       (RegexPattern *)TVar18.word,cVar3,uVar19);
    uVar24 = (ulong)GVar22 >> 0x20;
    local_80.word = 0xffffffff;
    if (uVar24 == 0xffffffff) {
      GVar16.offset = 0;
      GVar16.length = 0;
    }
    else {
      TVar14._0_4_ = (int)local_60.word + 3U & 0xffff;
      TVar14._4_4_ = 0;
      local_78.word = (Type)(local_308 + lVar20);
      do {
        TVar2.word = local_60.word;
        TVar18.word = local_78.word;
        TVar12.word = local_88.word;
        local_80.word = uVar24;
        local_50 = GVar22;
        local_38 = uVar19;
        if (local_60.word != 0) {
          uVar24 = 0;
          do {
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3de2b;
            GVar22 = UnifiedRegex::RegexPattern::GetGroup((RegexPattern *)TVar12.word,(int)uVar24);
            input_00.word = local_48.word;
            scriptContext_00.word = local_70.word;
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3de3e;
            pvVar7 = GetString((ScriptContext *)scriptContext_00.word,
                               (JavascriptString *)input_00.word,nonMatchValue,GVar22);
            ((Type)(TVar18.word + 8))[uVar24] = pvVar7;
            uVar24 = uVar24 + 1;
          } while (TVar2.word != uVar24);
        }
        uVar24 = (ulong)local_50 & 0xffffffff;
        if ((int)local_50.offset < 0) {
          local_58.word = (Type)(double)uVar24;
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3de83;
          uVar8 = NumberUtilities::ToSpecial((double)uVar24);
          TVar12.word = local_58.word;
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3de90;
          bVar4 = NumberUtilities::IsNan((double)TVar12.word);
          uVar19 = local_38;
          TVar18.word = local_58.word;
          TVar12.word = local_70.word;
          if (bVar4) {
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dea9;
            uVar9 = NumberUtilities::ToSpecial((double)TVar18.word);
            TVar18.word = local_58.word;
            if (uVar9 != 0xfff8000000000000) {
              *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dec2;
              uVar9 = NumberUtilities::ToSpecial((double)TVar18.word);
              if (uVar9 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dedf;
                Throw::LogAssert();
                *puVar6 = 1;
                *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3df0d;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar4) goto LAB_00d3e2c4;
                *puVar6 = 0;
              }
            }
          }
          pvVar15 = (void *)(uVar8 ^ 0xfffc000000000000);
        }
        else {
          pvVar15 = (void *)(uVar24 | 0x1000000000000);
          TVar12.word = local_70.word;
          uVar19 = local_38;
        }
        TVar18.word = local_68.word;
        ((Type)(local_78.word + 8))[TVar2.word] = pvVar15;
        pTVar11 = *(ThreadContext **)
                   ((((ThreadContext *)TVar12.word)->backgroundPageQueue).
                    backgroundPageQueueCriticalSection.super_CCLock.mutexPtr + 0x38);
        local_58.word._0_1_ = pTVar11->reentrancySafeOrHandled;
        pTVar11->reentrancySafeOrHandled = true;
        *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3df5a;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)TVar18.word);
        *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3df69;
        bVar4 = ThreadContext::HasNoSideEffect(pTVar11,(RecyclableObject *)TVar18.word,attributes);
        TVar18.word = local_68.word;
        if (bVar4) {
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3df76;
          p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)TVar18.word);
          TVar18.word = local_68.word;
          if (0xfffc < (ushort)local_60.word) {
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e2c4;
            ::Math::DefaultOverflowPolicy();
          }
          local_98.Values = (Type)local_78.word;
          local_98.Info = TVar14;
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dfaf;
          ptr = (RecyclableObject *)
                JavascriptFunction::CallFunction<true>
                          ((RecyclableObject *)TVar18.word,p_Var10,&local_98,false);
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dfba;
          bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00d3dfba:
          if (bVar4 != false) {
            pTVar11->implicitCallFlags = pTVar11->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((pTVar11->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e13c;
            p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)TVar18.word);
            TVar18.word = local_68.word;
            if (0xfffc < (ushort)local_60.word) {
              *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e2cb;
              ::Math::DefaultOverflowPolicy();
            }
            local_98.Values = (Type)local_78.word;
            local_98.Info = TVar14;
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e175;
            ptr = (RecyclableObject *)
                  JavascriptFunction::CallFunction<true>
                            ((RecyclableObject *)TVar18.word,p_Var10,&local_98,false);
            *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e180;
            bVar4 = ThreadContext::IsOnStack(ptr);
            goto LAB_00d3dfba;
          }
          local_31 = pTVar11->implicitCallFlags;
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3dffb;
          p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)TVar18.word);
          TVar18.word = local_68.word;
          if (0xfffc < (ushort)local_60.word) {
            *(undefined1 **)(local_308 + lVar20 + -8) = &LAB_00d3e2d0;
            ::Math::DefaultOverflowPolicy();
          }
          local_98.Values = (Type)local_78.word;
          local_98.Info = TVar14;
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e034;
          ptr = (RecyclableObject *)
                JavascriptFunction::CallFunction<true>
                          ((RecyclableObject *)TVar18.word,p_Var10,&local_98,false);
          pTVar11->implicitCallFlags = local_31 | ImplicitCall_Accessor;
        }
        else {
          pTVar11->implicitCallFlags = pTVar11->implicitCallFlags | ImplicitCall_Accessor;
          ptr = (((((((((Type *)(local_68.word + 8))->ptr->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        pTVar11->reentrancySafeOrHandled = local_58.word._0_1_;
        *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e088;
        pTVar11 = (ThreadContext *)JavascriptConversion::ToString(ptr,(ScriptContext *)TVar12.word);
        TVar18.word = local_48.word;
        this_01 = concatenated._520_8_;
        CVar13 = local_50.offset - uVar19;
        if (concatenated._520_8_ == 0) {
          replacefn._0_4_ = 0;
          replacefn._4_4_ = 0;
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e0c6;
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    ((JavascriptString *)TVar18.word,uVar19,CVar13,(Builder<256U> *)local_308,false)
          ;
        }
        else {
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e0ac;
          CompoundString::Append
                    ((CompoundString *)this_01,(JavascriptString *)TVar18.word,uVar19,CVar13);
        }
        pTVar17 = (ThreadContext *)concatenated._520_8_;
        if (concatenated._520_8_ == 0) {
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e0ed;
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    ((JavascriptString *)pTVar11,(Builder<256U> *)local_308,false);
        }
        else {
          *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e0da;
          CompoundString::Append((CompoundString *)pTVar17,(JavascriptString *)pTVar11);
          pTVar11 = pTVar17;
        }
        GVar22 = local_50;
        pTVar17 = (ThreadContext *)concatenated._520_8_;
        uVar19 = local_50.offset;
        if ((ulong)local_50 >> 0x20 == 0) {
          if (uVar19 < local_3c) {
            c = input_01[uVar24];
            if (concatenated._520_8_ == 0) {
              pTVar11 = (ThreadContext *)(ulong)(ushort)c;
              *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e195;
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (c,(Builder<256U> *)local_308,false);
            }
            else {
              *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e128;
              CompoundString::Append((CompoundString *)pTVar17,c);
              pTVar11 = pTVar17;
            }
          }
          uVar19 = uVar19 + 1;
        }
        else {
          uVar19 = (int)local_80.word + uVar19;
        }
        cVar3 = local_3c;
        TVar18.word = local_88.word;
        GVar16 = GVar22;
        if (local_32 == false) {
          uVar24 = local_80.word << 0x20;
          local_38 = uVar19;
          goto LAB_00d3e1fa;
        }
        if (local_3c < uVar19) break;
        pTVar11 = (ThreadContext *)&concatenated.isFinalized;
        replacefn._4_4_ = 0;
        replacefn._0_4_ = uVar19;
        *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e1bd;
        GVar22 = PrimMatch((RegexMatchState *)pTVar11,(ScriptContext *)TVar12.word,
                           (RegexPattern *)TVar18.word,cVar3,uVar19);
        uVar24 = (ulong)GVar22 >> 0x20;
      } while (uVar24 != 0xffffffff);
    }
    local_38 = uVar19;
    uVar24 = 0xffffffff00000000;
LAB_00d3e1fa:
    uVar21 = local_80.word << 0x20;
    local_50 = (GroupInfo)((ulong)GVar16 & 0xffffffff);
    uVar23 = (ulong)GVar22 & 0xffffffff;
  }
  if (state.input != (char16 *)0x0) {
    *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e21f;
    ScriptContext::ReleaseTemporaryAllocator
              ((ScriptContext *)TVar12.word,(TempArenaAllocatorObject *)state.input);
    pTVar11 = (ThreadContext *)TVar12.word;
  }
  uVar19 = local_38;
  TVar12.word = local_48.word;
  if (local_38 != 0) {
    bVar4 = local_38 <= local_3c;
    CVar13 = local_3c - local_38;
    local_3c = CVar13;
    if (bVar4 && CVar13 != 0) {
      if (concatenated._520_8_ == 0) {
        replacefn._0_4_ = 0;
        replacefn._4_4_ = 0;
        *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e267;
        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                  ((JavascriptString *)TVar12.word,uVar19,CVar13,(Builder<256U> *)local_308,false);
      }
      else {
        *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e24d;
        CompoundString::Append
                  ((CompoundString *)concatenated._520_8_,(JavascriptString *)TVar12.word,uVar19,
                   CVar13);
      }
    }
    pTVar11 = (ThreadContext *)local_308;
    *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e273;
    TVar12.word = (Type)CompoundString::Builder<256U>::ToString((Builder<256U> *)pTVar11);
  }
  isGlobal = local_32;
  bVar4 = local_3d;
  GVar22 = (GroupInfo)(uVar21 | (ulong)local_50);
  *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e297;
  PropagateLastMatchToRegex
            ((ScriptContext *)pTVar11,isGlobal,bVar4,(JavascriptRegExp *)scriptContext,
             (GroupInfo)replacefn,(GroupInfo)(uVar24 | uVar23));
  TVar2.word = local_48.word;
  TVar18.word = local_70.word;
  *(undefined8 *)(local_308 + lVar20 + -8) = 0xd3e2ad;
  PropagateLastMatchToCtor
            ((ScriptContext *)TVar18.word,(JavascriptRegExp *)scriptContext,
             (JavascriptString *)TVar2.word,GVar22,false);
  return (ThreadContext *)TVar12.word;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, RecyclableObject* replacefn)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        JavascriptString* newString = nullptr;
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        const uint16 numGroups = pattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastMatch; // initially undefined

        // Regex parser should ensure this condition holds, but let's be doubly sure.
        // numGroups is always positive because the entire regex counts as a capturing group.
        AssertOrFailFast(0 < numGroups && numGroups <= INT16_MAX);

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("<replace function>")));
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        // NOTE: These must be kept out of the scope of the try below!
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = true, set lastIndex to 0 in case it is used in replacefn
        if (isGlobal)
        {
            regularExpression->SetLastIndex(0);
        }

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);
        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;

        // Replace function must be called with arguments (<function's this>, group0, ..., groupn, offset, input)
        // The garbage collector must know about this array since it is being passed back into script land
        Var* replaceArgs;
        PROBE_STACK_NO_DISPOSE(scriptContext, (numGroups + 3) * sizeof(Var));
        replaceArgs = (Var*)_alloca((numGroups + 3) * sizeof(Var));
        replaceArgs[0] = scriptContext->GetLibrary()->GetUndefined();
        replaceArgs[numGroups + 2] = input;

        if (offset > 0)
        {
            concatenated.Append(input, 0, min(offset, inputLength));
        }

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }

            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;

            lastSuccessfulMatch = lastActualMatch;
            for (int groupId = 0;  groupId < numGroups; groupId++)
                replaceArgs[groupId + 1] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
            replaceArgs[numGroups + 1] = JavascriptNumber::ToVar(lastActualMatch.offset, scriptContext);

            // The called function must see the global state updated by the current match
            // (Should the function reach into a RegExp field, the pattern will still be valid, thus there's no
            //  danger of the primitive regex matcher being re-entered)

            // WARNING: We go off into script land here, which way in turn invoke a regex operation, even on the
            //          same regex.

            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                    return JavascriptFunction::CallFunction<true>(replacefn, replacefn->GetEntryPoint(), Arguments(CallInfo(UInt16Math::Add(numGroups, 3)), replaceArgs));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            concatenated.Append(input, offset, lastActualMatch.offset - offset);
            concatenated.Append(replace);

            if (lastActualMatch.length == 0)
            {
                if (lastActualMatch.offset < inputLength)
                {
                    concatenated.Append(inputStr[lastActualMatch.offset]);
                }
                offset = lastActualMatch.offset + 1;
            }
            else
            {
                offset = lastActualMatch.EndOffset();
            }
        }
        while (isGlobal);

        PrimEndMatch(state, scriptContext, pattern);

        if (offset == 0)
        {
            // There was no successful match so the result is the input string.
            newString = input;
        }
        else
        {
            if (offset < inputLength)
            {
                concatenated.Append(input, offset, inputLength - offset);
            }
            newString = concatenated.ToString();
        }

        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }